

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssmain.cpp
# Opt level: O2

void asm_run(void)

{
  size_t sVar1;
  
  strcpy(sasm.exeInfoFilename,sasm.exeFileName);
  sVar1 = strlen(sasm.exeInfoFilename);
  builtin_strncpy(sasm.exeInfoFilename + sVar1,".inf",4);
  (sasm.exeInfoFilename + sVar1 + 4)[0] = 'o';
  (sasm.exeInfoFilename + sVar1 + 4)[1] = '\0';
  _asm_::Init();
  _asm_::LoadSourceFile();
  _asm_::AssembleSourceFile();
  _asm_::BuildSSE();
  if (sasm.isBuildInfo != 0) {
    _asm_::BuildSSE_Info();
  }
  _asm_::ShutDown();
  return;
}

Assistant:

void asm_run()
{
	strcpy(sasm.exeInfoFilename, sasm.exeFileName);
	strcat(sasm.exeInfoFilename, ".info");

	_asm_::Init();

	_asm_::LoadSourceFile();

	_asm_::AssembleSourceFile();

	_asm_::BuildSSE();

	if (sasm.isBuildInfo)
		_asm_::BuildSSE_Info();

	_asm_::ShutDown();
}